

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::correctOutput(HlslParseContext *this,TQualifier *qualifier)

{
  bool bVar1;
  uint uVar2;
  TQualifier *qualifier_local;
  HlslParseContext *this_local;
  
  clearUniform(this,qualifier);
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
    TQualifier::clearInterstage(qualifier);
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangGeometry) {
    TQualifier::clearStreamLayout(qualifier);
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
    TQualifier::clearXfbLayout(qualifier);
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangTessControl) {
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffefffffffffff;
  }
  if ((*(ulong *)&qualifier->field_0x8 >> 7 & 0x1ff) == 0) {
    *(ulong *)&qualifier->field_0x8 =
         *(ulong *)&qualifier->field_0x8 & 0xffffffffffff007f |
         (ulong)((uint)((ulong)*(undefined8 *)&qualifier->field_0x8 >> 0x10) & 0x1ff) << 7;
  }
  uVar2 = *(uint *)&qualifier->field_0x8 >> 7 & 0x1ff;
  if (uVar2 == 0x43) {
    TIntermediate::setDepthReplacing
              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    TIntermediate::setDepth
              ((this->super_TParseContextBase).super_TParseVersions.intermediate,EldAny);
  }
  else if (uVar2 == 0x91) {
    TIntermediate::setDepthReplacing
              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    TIntermediate::setDepth
              ((this->super_TParseContextBase).super_TParseVersions.intermediate,EldGreater);
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffff007f | 0x2180;
  }
  else if (uVar2 == 0x92) {
    TIntermediate::setDepthReplacing
              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    TIntermediate::setDepth
              ((this->super_TParseContextBase).super_TParseVersions.intermediate,EldLess);
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffff007f | 0x2180;
  }
  bVar1 = isOutputBuiltIn(this,qualifier);
  if (!bVar1) {
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffff007f;
  }
  return;
}

Assistant:

void HlslParseContext::correctOutput(TQualifier& qualifier)
{
    clearUniform(qualifier);
    if (language == EShLangFragment)
        qualifier.clearInterstage();
    if (language != EShLangGeometry)
        qualifier.clearStreamLayout();
    if (language == EShLangFragment)
        qualifier.clearXfbLayout();
    if (language != EShLangTessControl)
        qualifier.patch = false;

    // Fixes Test/hlsl.entry-inout.vert (SV_Position will not become a varying).
    if (qualifier.builtIn == EbvNone)
        qualifier.builtIn = qualifier.declaredBuiltIn;

    switch (qualifier.builtIn) {
    case EbvFragDepth:
        intermediate.setDepthReplacing();
        intermediate.setDepth(EldAny);
        break;
    case EbvFragDepthGreater:
        intermediate.setDepthReplacing();
        intermediate.setDepth(EldGreater);
        qualifier.builtIn = EbvFragDepth;
        break;
    case EbvFragDepthLesser:
        intermediate.setDepthReplacing();
        intermediate.setDepth(EldLess);
        qualifier.builtIn = EbvFragDepth;
        break;
    default:
        break;
    }

    if (! isOutputBuiltIn(qualifier))
        qualifier.builtIn = EbvNone;
}